

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::AssertionInfo::~AssertionInfo(AssertionInfo *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->capturedExpression)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->capturedExpression).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->lineInfo).file._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->lineInfo).file.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->macroName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->macroName).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

AssertionInfo() {}